

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type_conflict1
time_plain<boost::random::lagged_fibonacci_01_engine<double,48,9689u,5502u>>
          (lagged_fibonacci_01_engine<double,_48,_9689U,_5502U> *r)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  string res;
  string local_40;
  double local_20;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar1 = r->i;
  dVar5 = 0.0;
  lVar4 = 0x1000000;
  do {
    if (0x25d8 < uVar1) {
      boost::random::lagged_fibonacci_01_engine<double,_48,_9689U,_5502U>::fill(r);
      uVar1 = r->i;
    }
    uVar3 = (ulong)uVar1;
    uVar1 = uVar1 + 1;
    r->i = uVar1;
    dVar5 = dVar5 + r->x[uVar3];
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar4 - lVar2) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return dVar5;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}